

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

bool QJsonValueConstRef::concreteBool(QJsonValueConstRef self,bool defaultValue)

{
  long lVar1;
  QJsonValueConstRef r;
  Element *pEVar2;
  byte in_DL;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  Element *e;
  bool local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = (bool)(in_DL & 1);
  r._8_8_ = in_RDI;
  r.field_0.d = in_RSI.d;
  pEVar2 = QJsonPrivate::Value::elementHelper(r);
  if (pEVar2->type == False) {
    local_29 = false;
  }
  else if (pEVar2->type == True) {
    local_29 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QJsonValueConstRef::concreteBool(QJsonValueConstRef self, bool defaultValue) noexcept
{
    auto &e = QJsonPrivate::Value::elementHelper(self);
    if (e.type == QCborValue::False)
        return false;
    if (e.type == QCborValue::True)
        return true;
    return defaultValue;
}